

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

void updatewindow(zng_stream *strm,uint8_t *end,uint32_t len,int32_t cksum)

{
  internal_state *piVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *dst;
  uint uVar4;
  
  piVar1 = strm->state;
  uVar3 = piVar1->w_size;
  if (uVar3 == 0) {
    uVar3 = 1 << ((byte)piVar1->block_open & 0x1f);
    piVar1->w_size = uVar3;
  }
  if (len < uVar3) {
    uVar3 = uVar3 - piVar1->lookahead;
    uVar4 = len;
    if (uVar3 < len) {
      uVar4 = uVar3;
    }
    dst = (uint8_t *)((ulong)piVar1->lookahead + *(long *)&piVar1->high_water);
    if (cksum == 0) {
      memcpy(dst,end + -(ulong)len,(ulong)uVar4);
      if (uVar3 < len) {
        uVar4 = len - uVar4;
        memcpy(*(void **)&piVar1->high_water,end + -(ulong)uVar4,(ulong)uVar4);
        goto LAB_0010a3d8;
      }
    }
    else {
      inf_chksum_cpy(strm,dst,end + -(ulong)len,uVar4);
      if (uVar3 < len) {
        uVar4 = len - uVar4;
        inf_chksum_cpy(strm,*(uint8_t **)&piVar1->high_water,end + -(ulong)uVar4,uVar4);
LAB_0010a3d8:
        piVar1->lookahead = uVar4;
        goto LAB_0010a417;
      }
    }
    uVar2 = piVar1->lookahead + uVar4;
    uVar3 = 0;
    if (uVar2 != piVar1->w_size) {
      uVar3 = uVar2;
    }
    piVar1->lookahead = uVar3;
    if (piVar1->w_size <= piVar1->w_mask) {
      return;
    }
    uVar4 = piVar1->w_mask + uVar4;
  }
  else {
    if (cksum == 0) {
      memcpy(*(void **)&piVar1->high_water,end + -(ulong)uVar3,(ulong)uVar3);
    }
    else {
      if (uVar3 <= len && len - uVar3 != 0) {
        inf_chksum(strm,end + -(ulong)len,len - uVar3);
        uVar3 = piVar1->w_size;
      }
      inf_chksum_cpy(strm,*(uint8_t **)&piVar1->high_water,end + -(ulong)uVar3,uVar3);
    }
    piVar1->lookahead = 0;
LAB_0010a417:
    uVar4 = piVar1->w_size;
  }
  piVar1->w_mask = uVar4;
  return;
}

Assistant:

static void updatewindow(PREFIX3(stream) *strm, const uint8_t *end, uint32_t len, int32_t cksum) {
    struct inflate_state *state;
    uint32_t dist;

    state = (struct inflate_state *)strm->state;

    /* if window not in use yet, initialize */
    if (state->wsize == 0)
        state->wsize = 1U << state->wbits;

    /* len state->wsize or less output bytes into the circular window */
    if (len >= state->wsize) {
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * it (s/390 being the primary exception to this) */
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            /* We have to split the checksum over non-copied and copied bytes */
            if (len > state->wsize)
                inf_chksum(strm, end - len, len - state->wsize);
            inf_chksum_cpy(strm, state->window, end - state->wsize, state->wsize);
        } else {
            memcpy(state->window, end - state->wsize, state->wsize);
        }

        state->wnext = 0;
        state->whave = state->wsize;
    } else {
        dist = state->wsize - state->wnext;
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * We need to maintain the correct order here for the checksum */
        dist = MIN(dist, len);
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            inf_chksum_cpy(strm, state->window + state->wnext, end - len, dist);
        } else {
            memcpy(state->window + state->wnext, end - len, dist);
        }
        len -= dist;
        if (len) {
            if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
                inf_chksum_cpy(strm, state->window, end - len, len);
            } else {
                memcpy(state->window, end - len, len);
            }

            state->wnext = len;
            state->whave = state->wsize;
        } else {
            state->wnext += dist;
            if (state->wnext == state->wsize)
                state->wnext = 0;
            if (state->whave < state->wsize)
                state->whave += dist;
        }
    }
}